

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

HttpClient * __thiscall
kj::anon_unknown_36::NetworkHttpClient::getClient(NetworkHttpClient *this,Url *parsed)

{
  String *pSVar1;
  size_t sVar2;
  PromiseArena *pPVar3;
  Detail *pDVar4;
  Fault node;
  undefined8 uVar5;
  Maybe<kj::EntropySource_&> MVar6;
  Maybe<kj::HttpClientErrorHandler_&> MVar7;
  Maybe<kj::SecureNetworkWrapper_&> MVar8;
  NetworkHttpClient *hosts;
  _Rb_tree_node_base *p_Var9;
  int iVar10;
  void *pvVar11;
  _Base_ptr p_Var12;
  _Rb_tree_node_base *p_Var13;
  _Rb_tree_node_base *p_Var14;
  size_t __n;
  _Base_ptr __n_00;
  _Base_ptr p_Var15;
  undefined1 uVar16;
  TransformPromiseNodeBase *this_00;
  Network *pNVar17;
  Url *pUVar18;
  undefined8 uVar19;
  char *__s2;
  _Base_ptr p_Var20;
  Exception *this_01;
  _Rb_tree_node_base *p_Var21;
  bool bVar22;
  bool bVar23;
  Fault f_1;
  Fault f;
  bool _kjCondition;
  Fault local_d0;
  Url *local_c8;
  _Rb_tree_node_base *local_c0;
  iterator local_b8;
  undefined1 local_b0 [56];
  Maybe<kj::EntropySource_&> local_78;
  Maybe<kj::HttpClientErrorHandler_&> MStack_70;
  ArrayDisposer *local_68;
  Maybe<kj::WebSocketErrorHandler_&> local_60;
  Maybe<kj::SecureNetworkWrapper_&> local_58;
  _Rb_tree_node_base *local_50;
  undefined1 local_48;
  NetworkHttpClient *local_40;
  _Rb_tree_node_base *local_38;
  
  sVar2 = (parsed->scheme).content.size_;
  __n = sVar2 + (sVar2 == 0);
  if (sVar2 == 5) {
    iVar10 = bcmp((parsed->scheme).content.ptr,"http",__n);
    bVar23 = iVar10 == 0;
    bVar22 = false;
  }
  else {
    if (sVar2 == 6) {
      iVar10 = bcmp((parsed->scheme).content.ptr,"https",__n);
      bVar22 = iVar10 == 0;
    }
    else {
      bVar22 = false;
    }
    bVar23 = false;
  }
  local_78.ptr._0_1_ = bVar23 | bVar22;
  if ((bVar23 | bVar22) == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
              ((Fault *)local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x18fc,FAILED,"isHttp || isHttps","_kjCondition,",(bool *)(local_b0 + 0x38));
    kj::_::Debug::Fault::fatal((Fault *)local_b0);
  }
  local_b8._M_node = (_Base_ptr)&this->httpHosts;
  if (bVar22 != false) {
    local_b8._M_node = (_Base_ptr)&this->httpsHosts;
  }
  sVar2 = (parsed->host).content.size_;
  if (sVar2 == 0) {
    __s2 = "";
  }
  else {
    __s2 = (parsed->host).content.ptr;
  }
  p_Var20 = (_Base_ptr)(sVar2 + (sVar2 == 0));
  p_Var12 = (local_b8._M_node)->_M_left;
  p_Var13 = (_Rb_tree_node_base *)&(local_b8._M_node)->_M_parent;
  local_c8 = parsed;
  local_c0 = p_Var13;
  local_40 = this;
  if (p_Var12 != (_Rb_tree_node_base *)0x0) {
    do {
      p_Var15 = p_Var12[1]._M_parent;
      __n_00 = p_Var15;
      if (p_Var15 >= p_Var20) {
        __n_00 = p_Var20;
      }
      iVar10 = memcmp(*(void **)(p_Var12 + 1),__s2,(size_t)__n_00);
      this = local_40;
      bVar23 = iVar10 < 0;
      if (iVar10 == 0) {
        bVar23 = p_Var15 < p_Var20;
      }
      if (bVar23 == false) {
        p_Var13 = p_Var12;
      }
      p_Var12 = (&p_Var12->_M_left)[bVar23];
    } while (p_Var12 != (_Base_ptr)0x0);
    if (p_Var13 != local_c0) {
      p_Var12 = p_Var13[1]._M_parent;
      p_Var15 = p_Var12;
      if (p_Var20 < p_Var12) {
        p_Var15 = p_Var20;
      }
      iVar10 = memcmp(__s2,*(void **)(p_Var13 + 1),(size_t)p_Var15);
      bVar23 = iVar10 < 0;
      if (iVar10 == 0) {
        bVar23 = p_Var20 < p_Var12;
      }
      if (!bVar23) goto LAB_003b413f;
    }
  }
  if (bVar22 == false) {
    pNVar17 = this->network;
    uVar19 = 0x50;
  }
  else {
    pNVar17 = (this->tlsNetwork).ptr;
    uVar19 = 0x1bb;
    if (pNVar17 == (Network *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
                ((Fault *)local_b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x190e,FAILED,"tlsNetwork != nullptr","\"this HttpClient doesn\'t support HTTPS\""
                 ,(char (*) [38])"this HttpClient doesn\'t support HTTPS");
      kj::_::Debug::Fault::fatal((Fault *)local_b0);
    }
  }
  (**pNVar17->_vptr_Network)(local_b0,pNVar17,__s2,p_Var20,uVar19);
  uVar19 = local_b0._0_8_;
  pPVar3 = *(PromiseArena **)(local_b0._0_8_ + 8);
  if (pPVar3 == (PromiseArena *)0x0 || (ulong)(local_b0._0_8_ - (long)pPVar3) < 0x28) {
    pvVar11 = operator_new(0x400);
    this_01 = (Exception *)((long)pvVar11 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_01,(OwnPromiseNode *)local_b0,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6418:17)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    *(undefined ***)((long)pvVar11 + 0x3d8) = &PTR_destroy_0061ba78;
    *(NetworkHttpClient **)((long)pvVar11 + 0x3f8) = this;
    *(void **)((long)pvVar11 + 0x3e0) = pvVar11;
  }
  else {
    *(PromiseArena **)(local_b0._0_8_ + 8) = (PromiseArena *)0x0;
    this_01 = (Exception *)(local_b0._0_8_ + -0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_01,(OwnPromiseNode *)local_b0,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6418:17)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    *(undefined ***)(uVar19 + -0x28) = &PTR_destroy_0061ba78;
    *(NetworkHttpClient **)(uVar19 + -8) = this;
    ((PromiseArenaMember *)(uVar19 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar3;
  }
  uVar19 = local_b0._0_8_;
  pUVar18 = local_c8;
  pSVar1 = &local_c8->host;
  if ((Exception *)local_b0._0_8_ != (Exception *)0x0) {
    local_b0._0_8_ = (Exception *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar19);
  }
  local_78.ptr = (EntropySource *)(pUVar18->host).content.ptr;
  MStack_70.ptr = (HttpClientErrorHandler *)(pUVar18->host).content.size_;
  local_68 = (pUVar18->host).content.disposer;
  (pSVar1->content).ptr = (char *)0x0;
  (pUVar18->host).content.size_ = 0;
  p_Var12 = (_Base_ptr)operator_new(0x30);
  *(undefined ***)p_Var12 = &PTR_request_0061bad0;
  pDVar4 = (Detail *)(this_01->ownFile).content.size_;
  local_d0.exception = this_01;
  if (pDVar4 == (Detail *)0x0 || (ulong)((long)this_01 - (long)pDVar4) < 0x28) {
    pvVar11 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_d0,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6184:30)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    *(undefined ***)((long)pvVar11 + 0x3d8) = &PTR_destroy_0061bb10;
    *(_Base_ptr *)((long)pvVar11 + 0x3f8) = p_Var12;
    *(void **)((long)pvVar11 + 0x3e0) = pvVar11;
  }
  else {
    (this_01->ownFile).content.size_ = 0;
    this_00 = (TransformPromiseNodeBase *)&this_01[-1].traceCount;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_d0,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6184:30)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    *(undefined ***)&this_01[-1].traceCount = &PTR_destroy_0061bb10;
    this_01[-1].details.builder.disposer = (ArrayDisposer *)p_Var12;
    this_01[-1].details.builder.ptr = pDVar4;
  }
  local_b0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_b0._8_8_ = "PromiseNetworkAddressHttpClient";
  local_b0._16_8_ = (Timer *)0x1100001828;
  local_50 = (_Rb_tree_node_base *)this_00;
  Promise<void>::fork((Promise<void> *)&p_Var12->_M_parent);
  p_Var13 = local_50;
  if (local_50 != (_Rb_tree_node_base *)0x0) {
    local_50 = (_Rb_tree_node_base *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)p_Var13);
  }
  node.exception = local_d0.exception;
  p_Var12->_M_right = (_Base_ptr)0x0;
  *(undefined8 *)(p_Var12 + 1) = 0;
  *(undefined1 *)&p_Var12[1]._M_parent = 0;
  local_60.ptr = (WebSocketErrorHandler *)
                 &kj::_::HeapDisposer<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient>::
                  instance;
  local_b0._48_8_ = p_Var12;
  if (local_d0.exception != (Exception *)0x0) {
    local_d0.exception = (Exception *)0x0;
    local_58.ptr = (SecureNetworkWrapper *)p_Var12;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.exception);
    local_b0._48_8_ = local_58.ptr;
  }
  local_b0._0_8_ = (Exception *)0x4b4903;
  if ((HttpHeaderTable *)MStack_70.ptr != (HttpHeaderTable *)0x0) {
    local_b0._0_8_ = local_78.ptr;
  }
  local_b0._8_8_ =
       (long)&(((Vector<kj::StringPtr> *)&(MStack_70.ptr)->_vptr_HttpClientErrorHandler)->builder).
              ptr + (ulong)((HttpHeaderTable *)MStack_70.ptr == (HttpHeaderTable *)0x0);
  local_b0._16_8_ = local_78.ptr;
  local_b0._24_8_ = MStack_70.ptr;
  local_b0._32_8_ = local_68;
  local_78.ptr = (EntropySource *)0x0;
  MStack_70.ptr = (HttpClientErrorHandler *)0x0;
  local_58.ptr = (SecureNetworkWrapper *)0x0;
  local_b0._40_8_ = local_60.ptr;
  p_Var13 = (_Rb_tree_node_base *)operator_new(0x58);
  *(undefined8 *)(p_Var13 + 1) = local_b0._0_8_;
  p_Var13[1]._M_parent = (_Base_ptr)local_b0._8_8_;
  p_Var13[1]._M_left = (_Base_ptr)local_b0._16_8_;
  p_Var13[1]._M_right = (_Base_ptr)local_b0._24_8_;
  local_b0._16_8_ = (Timer *)0x0;
  local_b0._24_8_ = (HttpHeaderTable *)0x0;
  *(undefined8 *)(p_Var13 + 2) = local_b0._32_8_;
  p_Var13[2]._M_parent = (_Base_ptr)local_b0._40_8_;
  p_Var13[2]._M_left = (_Base_ptr)local_b0._48_8_;
  local_b0._48_8_ = (long *)0x0;
  local_c8 = *(Url **)(p_Var13 + 1);
  p_Var12 = p_Var13[1]._M_parent;
  p_Var9 = (local_b8._M_node)->_M_left;
  p_Var21 = local_c0;
  if ((local_b8._M_node)->_M_left == (_Rb_tree_node_base *)0x0) {
LAB_003b3f69:
    if (p_Var21 != (local_b8._M_node)->_M_right) {
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var21);
      pvVar11 = *(void **)(p_Var14 + 1);
      p_Var20 = p_Var14[1]._M_parent;
      p_Var15 = p_Var12;
      if (p_Var20 < p_Var12) {
        p_Var15 = p_Var20;
      }
      goto LAB_003b3f93;
    }
LAB_003b3fbd:
    uVar16 = _S_black;
    bVar23 = true;
    if (local_c0 != p_Var21) {
      p_Var20 = p_Var21[1]._M_parent;
      p_Var15 = p_Var20;
      if (p_Var12 < p_Var20) {
        p_Var15 = p_Var12;
      }
      iVar10 = memcmp(local_c8,*(void **)(p_Var21 + 1),(size_t)p_Var15);
      bVar23 = iVar10 < 0;
      if (iVar10 == 0) {
        bVar23 = p_Var12 < p_Var20;
      }
    }
    std::_Rb_tree_insert_and_rebalance(bVar23,p_Var13,p_Var21,local_c0);
    local_b8._M_node[1]._M_parent =
         (_Base_ptr)((long)&(local_b8._M_node[1]._M_parent)->_M_color + 1);
  }
  else {
    do {
      p_Var14 = p_Var9;
      pvVar11 = *(void **)(p_Var14 + 1);
      p_Var20 = p_Var14[1]._M_parent;
      p_Var15 = p_Var20;
      if (p_Var12 < p_Var20) {
        p_Var15 = p_Var12;
      }
      iVar10 = memcmp(local_c8,pvVar11,(size_t)p_Var15);
      bVar23 = iVar10 < 0;
      if (iVar10 == 0) {
        bVar23 = p_Var12 < p_Var20;
      }
      p_Var9 = (&p_Var14->_M_left)[bVar23 ^ 1];
    } while ((&p_Var14->_M_left)[bVar23 ^ 1] != (_Base_ptr)0x0);
    p_Var21 = p_Var14;
    if (bVar23 != false) goto LAB_003b3f69;
LAB_003b3f93:
    pUVar18 = local_c8;
    local_38 = p_Var14;
    iVar10 = memcmp(pvVar11,local_c8,(size_t)p_Var15);
    bVar23 = p_Var20 < p_Var12;
    if (iVar10 != 0) {
      bVar23 = iVar10 < 0;
    }
    if (bVar23) goto LAB_003b3fbd;
    std::
    _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
    ::_M_drop_node((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                    *)p_Var13,(_Link_type)pUVar18);
    uVar16 = _S_red;
    p_Var13 = local_38;
  }
  hosts = local_40;
  uVar19 = local_b0._48_8_;
  local_50 = p_Var13;
  local_48 = uVar16;
  if ((long *)local_b0._48_8_ != (long *)0x0) {
    local_b0._48_8_ = (long *)0x0;
    (***(_func_int ***)local_b0._40_8_)(local_b0._40_8_,uVar19 + *(long *)(*(long *)uVar19 + -0x10))
    ;
  }
  uVar5 = local_b0._24_8_;
  uVar19 = local_b0._16_8_;
  if ((Timer *)local_b0._16_8_ != (Timer *)0x0) {
    local_b0._16_8_ = (Timer *)0x0;
    local_b0._24_8_ = (HttpHeaderTable *)0x0;
    (***(_func_int ***)local_b0._32_8_)(local_b0._32_8_,uVar19,1,uVar5,uVar5,0);
  }
  local_b0._0_8_ = &stack0xffffffffffffffb8;
  if (uVar16 == _S_red) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
              (&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x191e,FAILED,"insertResult.second","_kjCondition,",
               (DebugExpression<bool_&> *)local_b0);
    kj::_::Debug::Fault::fatal(&local_d0);
  }
  handleCleanup((NetworkHttpClient *)local_b0,
                (map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                 *)hosts,local_b8);
  TaskSet::add(&hosts->tasks,(Promise<void> *)local_b0);
  uVar19 = local_b0._0_8_;
  if ((Exception *)local_b0._0_8_ != (Exception *)0x0) {
    local_b0._0_8_ = (Exception *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar19);
  }
  MVar8.ptr = local_58.ptr;
  if (local_58.ptr != (SecureNetworkWrapper *)0x0) {
    local_58.ptr = (SecureNetworkWrapper *)0x0;
    (**(local_60.ptr)->_vptr_WebSocketErrorHandler)
              (local_60.ptr,
               (MVar8.ptr)->_vptr_SecureNetworkWrapper[-2] +
               (long)&(MVar8.ptr)->_vptr_SecureNetworkWrapper);
  }
  MVar7.ptr = MStack_70.ptr;
  MVar6.ptr = local_78.ptr;
  if (local_78.ptr != (EntropySource *)0x0) {
    local_78.ptr = (EntropySource *)0x0;
    MStack_70.ptr = (HttpClientErrorHandler *)0x0;
    (**local_68->_vptr_ArrayDisposer)(local_68,MVar6.ptr,1,MVar7.ptr,MVar7.ptr,0);
  }
LAB_003b413f:
  return (HttpClient *)p_Var13[2]._M_left;
}

Assistant:

HttpClient& getClient(kj::Url& parsed) {
    bool isHttps = parsed.scheme == "https";
    bool isHttp = parsed.scheme == "http";
    KJ_REQUIRE(isHttp || isHttps);

    auto& hosts = isHttps ? httpsHosts : httpHosts;

    // Look for a cached client for this host.
    // TODO(perf): It would be nice to recognize when different hosts have the same address and
    //   reuse the same connection pool, but:
    //   - We'd need a reliable way to compare NetworkAddresses, e.g. .equals() and .hashCode().
    //     It's very Java... ick.
    //   - Correctly handling TLS would be tricky: we'd need to verify that the new hostname is
    //     on the certificate. When SNI is in use we might have to request an additional
    //     certificate (is that possible?).
    auto iter = hosts.find(parsed.host);

    if (iter == hosts.end()) {
      // Need to open a new connection.
      kj::Network* networkToUse = &network;
      if (isHttps) {
        networkToUse = &KJ_REQUIRE_NONNULL(tlsNetwork, "this HttpClient doesn't support HTTPS");
      }

      auto promise = networkToUse->parseAddress(parsed.host, isHttps ? 443 : 80)
          .then([this](kj::Own<kj::NetworkAddress> addr) {
        return kj::heap<NetworkAddressHttpClient>(
            timer, responseHeaderTable, kj::mv(addr), settings);
      });

      Host host {
        kj::mv(parsed.host),
        kj::heap<PromiseNetworkAddressHttpClient>(kj::mv(promise))
      };
      kj::StringPtr nameRef = host.name;

      auto insertResult = hosts.insert(std::make_pair(nameRef, kj::mv(host)));
      KJ_ASSERT(insertResult.second);
      iter = insertResult.first;

      tasks.add(handleCleanup(hosts, iter));
    }

    return *iter->second.client;
  }